

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O0

void __thiscall CPubKey::Serialize<DataStream>(CPubKey *this,DataStream *s)

{
  Span<const_unsigned_char> *in_RSI;
  CPubKey *in_RDI;
  long in_FS_OFFSET;
  uint len;
  uint64_t in_stack_ffffffffffffffc0;
  DataStream *in_stack_ffffffffffffffc8;
  DataStream *this_00;
  pointer local_8;
  
  local_8 = *(pointer *)(in_FS_OFFSET + 0x28);
  size(in_RDI);
  WriteCompactSize<DataStream>(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  this_00 = (DataStream *)&stack0xffffffffffffffe8;
  Span<const_unsigned_char>::Span<const_unsigned_char,_0>
            ((Span<const_unsigned_char> *)this_00,(uchar *)in_RSI,(size_t)in_RDI);
  DataStream::operator<<(this_00,in_RSI);
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& s) const
    {
        unsigned int len = size();
        ::WriteCompactSize(s, len);
        s << Span{vch, len};
    }